

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::MemberSorter::operator()
          (MemberSorter *this,uint32_t mbr_idx1,uint32_t mbr_idx2)

{
  Decoration *pDVar1;
  Decoration *pDVar2;
  Decoration *mbr_meta2;
  Decoration *mbr_meta1;
  uint32_t mbr_idx2_local;
  uint32_t mbr_idx1_local;
  MemberSorter *this_local;
  
  pDVar1 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                     (&(this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>,
                      (ulong)mbr_idx1);
  pDVar2 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                     (&(this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>,
                      (ulong)mbr_idx2);
  if (this->sort_aspect == LocationThenBuiltInType) {
    if ((pDVar1->builtin & 1U) == (pDVar2->builtin & 1U)) {
      if ((pDVar1->builtin & 1U) == 0) {
        if (pDVar1->location == pDVar2->location) {
          this_local._7_1_ = pDVar1->component < pDVar2->component;
        }
        else {
          this_local._7_1_ = pDVar1->location < pDVar2->location;
        }
      }
      else {
        this_local._7_1_ = (int)pDVar1->builtin_type < (int)pDVar2->builtin_type;
      }
    }
    else {
      this_local._7_1_ = (bool)(pDVar2->builtin & 1);
    }
  }
  else {
    this_local._7_1_ = pDVar1->offset < pDVar2->offset;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::MemberSorter::operator()(uint32_t mbr_idx1, uint32_t mbr_idx2)
{
	auto &mbr_meta1 = meta.members[mbr_idx1];
	auto &mbr_meta2 = meta.members[mbr_idx2];

	if (sort_aspect == LocationThenBuiltInType)
	{
		// Sort first by builtin status (put builtins at end), then by the sorting aspect.
		if (mbr_meta1.builtin != mbr_meta2.builtin)
			return mbr_meta2.builtin;
		else if (mbr_meta1.builtin)
			return mbr_meta1.builtin_type < mbr_meta2.builtin_type;
		else if (mbr_meta1.location == mbr_meta2.location)
			return mbr_meta1.component < mbr_meta2.component;
		else
			return mbr_meta1.location < mbr_meta2.location;
	}
	else
		return mbr_meta1.offset < mbr_meta2.offset;
}